

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

size_t display_allocated_blocks(ListNode *check_point)

{
  ListNode *result;
  long in_RDI;
  MallocBlockInfo block_info;
  size_t allocated_blocks;
  ListNode *node;
  ListNode *head;
  undefined8 in_stack_ffffffffffffffd8;
  int line;
  undefined8 *puVar1;
  char *file;
  char *in_stack_ffffffffffffffe8;
  ListNode *expression;
  
  line = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  result = get_allocated_blocks_list();
  file = (char *)0x0;
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffe8,(char *)0x0,line);
  _assert_true((unsigned_long)result,in_stack_ffffffffffffffe8,file,line);
  for (expression = *(ListNode **)(in_RDI + 0x10); expression != result;
      expression = expression->next) {
    puVar1 = (undefined8 *)expression->value;
    _assert_true((unsigned_long)result,(char *)expression,file,(int)((ulong)puVar1 >> 0x20));
    if (file == (char *)0x0) {
      cm_print_error("Blocks allocated...\n");
    }
    cm_print_error("%s:%u: note: block %p allocated here\n",puVar1[3],(ulong)*(uint *)(puVar1 + 4),
                   *puVar1);
    file = file + 1;
  }
  return (size_t)file;
}

Assistant:

static size_t display_allocated_blocks(const ListNode * const check_point) {
    const ListNode * const head = get_allocated_blocks_list();
    const ListNode *node;
    size_t allocated_blocks = 0;
    assert_non_null(check_point);
    assert_non_null(check_point->next);

    for (node = check_point->next; node != head; node = node->next) {
        const MallocBlockInfo block_info = {
            .ptr = discard_const(node->value),
        };
        assert_non_null(block_info.ptr);

        if (allocated_blocks == 0) {
            cm_print_error("Blocks allocated...\n");
        }
        cm_print_error(SOURCE_LOCATION_FORMAT ": note: block %p allocated here\n",
                       block_info.data->location.file,
                       block_info.data->location.line,
                       block_info.data->block);
        allocated_blocks++;
    }
    return allocated_blocks;
}